

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::EquilibrateMatrix(Model *this)

{
  double *pdVar1;
  long in_RDI;
  int *__exponent;
  valarray<double> *this_00;
  double __x;
  double dVar2;
  Int p_2;
  Int j_2;
  int exp_2;
  Int j_1;
  int exp_1;
  Int i_1;
  bool out_of_range_1;
  double xa;
  Int i;
  Int p_1;
  Int j;
  Int round;
  Vector rowmax;
  Vector colmax;
  int exp;
  Int p;
  bool out_of_range;
  Int maxround;
  int expmax;
  int expmin;
  double *Ax;
  Int *Ai;
  Int *Ap;
  Int n;
  Int m;
  double *in_stack_fffffffffffffe48;
  valarray<double> *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  valarray<double> *in_stack_fffffffffffffe60;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  byte local_a1;
  double local_a0;
  Int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  int local_80;
  valarray<double> local_70;
  valarray<double> local_60;
  undefined8 local_50;
  undefined8 local_48;
  int local_40;
  int local_3c;
  byte local_35;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  double *local_28;
  Int *local_20;
  Int *local_18;
  Int local_10;
  Int local_c;
  
  local_c = SparseMatrix::rows((SparseMatrix *)(in_RDI + 0x208));
  local_10 = SparseMatrix::cols((SparseMatrix *)0x849d26);
  local_18 = SparseMatrix::colptr((SparseMatrix *)0x849d41);
  local_20 = SparseMatrix::rowidx((SparseMatrix *)0x849d5d);
  local_28 = SparseMatrix::values((SparseMatrix *)0x849d79);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50);
  __exponent = (int *)(in_RDI + 0x2b0);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50);
  local_2c = 0;
  local_30 = 3;
  local_34 = 10;
  local_35 = 0;
  for (local_3c = 0; local_3c < local_18[local_10]; local_3c = local_3c + 1) {
    std::abs((int)__exponent);
    __exponent = &local_40;
    frexp(__x,__exponent);
    if ((local_40 < 0) || (3 < local_40)) {
      local_35 = 1;
      break;
    }
  }
  if ((local_35 & 1) != 0) {
    std::valarray<double>::resize
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50
              );
    std::valarray<double>::resize
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50
              );
    local_48 = 0x3ff0000000000000;
    std::valarray<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_50 = 0x3ff0000000000000;
    std::valarray<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::valarray<double>::valarray(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    std::valarray<double>::valarray(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    for (local_80 = 0; local_80 < 10; local_80 = local_80 + 1) {
      local_88 = 0;
      std::valarray<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      for (local_8c = 0; local_8c < local_10; local_8c = local_8c + 1) {
        this_00 = &local_60;
        pdVar1 = std::valarray<double>::operator[](this_00,(long)local_8c);
        *pdVar1 = 0.0;
        for (local_90 = local_18[local_8c]; local_90 < local_18[local_8c + 1];
            local_90 = local_90 + 1) {
          local_94 = local_20[local_90];
          std::abs((int)this_00);
          pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_8c);
          pdVar1 = std::max<double>(pdVar1,&local_a0);
          dVar2 = *pdVar1;
          pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_8c);
          *pdVar1 = dVar2;
          pdVar1 = std::valarray<double>::operator[](&local_70,(long)local_94);
          pdVar1 = std::max<double>(pdVar1,&local_a0);
          dVar2 = *pdVar1;
          this_00 = &local_70;
          pdVar1 = std::valarray<double>::operator[](this_00,(long)local_94);
          *pdVar1 = dVar2;
        }
      }
      local_a1 = 0;
      for (local_a8 = 0; local_a8 < local_c; local_a8 = local_a8 + 1) {
        pdVar1 = std::valarray<double>::operator[](&local_70,(long)local_a8);
        frexp(*pdVar1,&local_ac);
        dVar2 = EquilibrationFactor((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                                    (int)in_stack_fffffffffffffe48,0);
        pdVar1 = std::valarray<double>::operator[](&local_70,(long)local_a8);
        *pdVar1 = dVar2;
        pdVar1 = std::valarray<double>::operator[](&local_70,(long)local_a8);
        if ((*pdVar1 != 1.0) || (NAN(*pdVar1))) {
          local_a1 = 1;
          pdVar1 = std::valarray<double>::operator[](&local_70,(long)local_a8);
          dVar2 = *pdVar1;
          pdVar1 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0x2b0),(long)local_a8);
          *pdVar1 = dVar2 * *pdVar1;
        }
      }
      for (local_b0 = 0; local_b0 < local_10; local_b0 = local_b0 + 1) {
        pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_b0);
        frexp(*pdVar1,&local_b4);
        dVar2 = EquilibrationFactor((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                                    (int)in_stack_fffffffffffffe48,0);
        pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_b0);
        *pdVar1 = dVar2;
        pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_b0);
        if ((*pdVar1 != 1.0) || (NAN(*pdVar1))) {
          local_a1 = 1;
          pdVar1 = std::valarray<double>::operator[](&local_60,(long)local_b0);
          dVar2 = *pdVar1;
          pdVar1 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0x2a0),(long)local_b0);
          *pdVar1 = dVar2 * *pdVar1;
        }
      }
      if ((local_a1 & 1) == 0) break;
      for (local_b8 = 0; local_b8 < local_10; local_b8 = local_b8 + 1) {
        for (local_bc = local_18[local_b8]; local_bc < local_18[local_b8 + 1];
            local_bc = local_bc + 1) {
          in_stack_fffffffffffffe50 =
               (valarray<double> *)std::valarray<double>::operator[](&local_60,(long)local_b8);
          local_28[local_bc] = local_28[local_bc] * (double)in_stack_fffffffffffffe50->_M_size;
          in_stack_fffffffffffffe48 =
               std::valarray<double>::operator[](&local_70,(long)local_20[local_bc]);
          local_28[local_bc] = *in_stack_fffffffffffffe48 * local_28[local_bc];
        }
      }
    }
    std::valarray<double>::~valarray(in_stack_fffffffffffffe50);
    std::valarray<double>::~valarray(in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

void Model::EquilibrateMatrix() {
    const Int m = A_.rows();
    const Int n = A_.cols();
    const Int* Ap = A_.colptr();
    const Int* Ai = A_.rowidx();
    double* Ax = A_.values();

    colscale_.resize(0);
    rowscale_.resize(0);

    // The absolute value of each nonzero entry of AI can be written as x*2^exp
    // with x in the range [0.5,1). We consider AI well scaled if each entry is
    // such that expmin <= exp <= expmax for parameters expmin and expmax.
    // For example,
    //
    //  expmin  expmax  allowed range
    //  -----------------------------
    //       0       2    [0.5,    4)
    //      -1       3    [0.25,   8)
    //       1       7    [1.0,  128)
    //
    // If AI is not well scaled, a recursive row and column equilibration is
    // applied. In each iteration, the scaling factors are roughly 1/sqrt(max),
    // where max is the maximum row or column entry. However, the factors are
    // truncated to powers of 2, so that no round-off errors occur.

    constexpr int expmin = 0;
    constexpr int expmax = 3;
    constexpr Int maxround = 10;

    // Quick return if entries are within the target range.
    bool out_of_range = false;
    for (Int p = 0; p < Ap[n]; p++) {
        int exp;
        std::frexp(std::abs(Ax[p]), &exp);
        if (exp < expmin || exp > expmax) {
            out_of_range = true;
            break;
        }
    }
    if (!out_of_range)
        return;

    colscale_.resize(n);
    rowscale_.resize(m);
    colscale_ = 1.0;
    rowscale_ = 1.0;
    Vector colmax(n), rowmax(m);

    for (Int round = 0; round < maxround; round++) {
        // Compute infinity norm of each row and column.
        rowmax = 0.0;
        for (Int j = 0; j < n; j++) {
            colmax[j] = 0.0;
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Int i = Ai[p];
                double xa = std::abs(Ax[p]);
                colmax[j] = std::max(colmax[j], xa);
                rowmax[i] = std::max(rowmax[i], xa);
            }
        }
        // Replace rowmax and colmax entries by scaling factors from this round.
        bool out_of_range = false;
        for (Int i = 0; i < m; i++) {
            int exp;
            std::frexp(rowmax[i], &exp);
            rowmax[i] = EquilibrationFactor(expmin, expmax, exp);
            if (rowmax[i] != 1.0) {
                out_of_range = true;
                rowscale_[i] *= rowmax[i];
            }
        }
        for (Int j = 0; j < n; j++) {
            int exp;
            std::frexp(colmax[j], &exp);
            colmax[j] = EquilibrationFactor(expmin, expmax, exp);
            if (colmax[j] != 1.0) {
                out_of_range = true;
                colscale_[j] *= colmax[j];
            }
        }
        if (!out_of_range)
            break;
        // Rescale A.
        for (Int j = 0; j < n; j++) {
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Ax[p] *= colmax[j];     // column scaling
                Ax[p] *= rowmax[Ai[p]]; // row scaling
            }
        }
    }
}